

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

CPubKey * __thiscall wallet::LegacyScriptPubKeyMan::GenerateNewSeed(LegacyScriptPubKeyMan *this)

{
  byte bVar1;
  long in_RSI;
  CPubKey *in_RDI;
  long in_FS_OFFSET;
  CKey *in_stack_00000010;
  LegacyScriptPubKeyMan *in_stack_00000018;
  CKey key;
  CKey *in_stack_ffffffffffffffa8;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = (**(code **)(**(long **)(in_RSI + 8) + 0x20))(*(long **)(in_RSI + 8),0x100000000);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x4bc,"CPubKey wallet::LegacyScriptPubKeyMan::GenerateNewSeed()");
  }
  GenerateRandomKey(SUB81((ulong)local_18 >> 0x38,0));
  DeriveNewSeed(in_stack_00000018,in_stack_00000010);
  CKey::~CKey(in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CPubKey LegacyScriptPubKeyMan::GenerateNewSeed()
{
    assert(!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS));
    CKey key = GenerateRandomKey();
    return DeriveNewSeed(key);
}